

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SpectrumCheckerboardTexture *
pbrt::SpectrumCheckerboardTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RCX;
  TextureParameterDictionary *in_RSI;
  TextureMapping3DHandle map_1;
  AAMethod aaMethod;
  string aa;
  TextureMapping2DHandle map;
  SpectrumTextureHandle tex2;
  SpectrumTextureHandle tex1;
  SpectrumHandle one;
  SpectrumHandle zero;
  int dim;
  FileLoc *in_stack_00000260;
  Transform *in_stack_00000268;
  ParameterDictionary *in_stack_00000270;
  Allocator in_stack_00000278;
  string *in_stack_fffffffffffffde8;
  undefined6 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf6;
  undefined1 in_stack_fffffffffffffdf7;
  double *in_stack_fffffffffffffdf8;
  TextureParameterDictionary *this;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffe00;
  SpectrumTextureHandle *in_stack_fffffffffffffe08;
  SpectrumTextureHandle *args_2;
  SpectrumHandle *in_stack_fffffffffffffe10;
  TextureParameterDictionary *defaultValue;
  string *in_stack_fffffffffffffe18;
  string *name;
  allocator<char> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *in_stack_fffffffffffffe28;
  Allocator alloc_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  FileLoc *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  ParameterDictionary *in_stack_fffffffffffffe80;
  Allocator in_stack_fffffffffffffe88;
  undefined8 local_159;
  string local_138 [32];
  undefined1 local_118 [39];
  undefined1 local_f1 [41];
  undefined1 local_c8 [23];
  undefined1 local_b1 [41];
  undefined8 local_88;
  undefined8 local_78;
  allocator<char> local_51;
  string local_50 [36];
  int local_2c;
  TextureParameterDictionary *local_20;
  undefined8 local_10;
  SpectrumCheckerboardTexture *local_8;
  
  local_20 = in_RSI;
  local_10 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  iVar2 = TextureParameterDictionary::GetOneInt
                    ((TextureParameterDictionary *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                     in_stack_fffffffffffffde8,0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  local_2c = iVar2;
  if ((iVar2 == 2) || (iVar2 == 3)) {
    local_78 = 0;
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffff0;
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
              ((SpectrumHandle *)
               CONCAT17(in_stack_fffffffffffffdf7,
                        CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
               (ConstantSpectrum *)in_stack_fffffffffffffde8);
    local_88 = 0x3ff0000000000000;
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
              ((SpectrumHandle *)
               CONCAT17(in_stack_fffffffffffffdf7,
                        CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
               (ConstantSpectrum *)in_stack_fffffffffffffde8);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
    alloc_00.memoryResource = (memory_resource *)local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)alloc_00.memoryResource,(allocator<char> *)args);
    SpectrumHandle::SpectrumHandle
              ((SpectrumHandle *)
               CONCAT17(in_stack_fffffffffffffdf7,
                        CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
               (SpectrumHandle *)in_stack_fffffffffffffde8);
    local_c8._0_8_ = local_10;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)args,in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe10,(SpectrumType)((ulong)in_stack_fffffffffffffe08 >> 0x20),
               alloc_00);
    std::__cxx11::string::~string((string *)(local_b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    name = (string *)local_f1;
    defaultValue = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)alloc_00.memoryResource,(allocator<char> *)args);
    SpectrumHandle::SpectrumHandle
              ((SpectrumHandle *)
               CONCAT17(in_stack_fffffffffffffdf7,
                        CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
               (SpectrumHandle *)in_stack_fffffffffffffde8);
    local_118._16_8_ = local_10;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)args,name,(SpectrumHandle *)defaultValue,
               (SpectrumType)((ulong)in_stack_fffffffffffffe08 >> 0x20),alloc_00);
    std::__cxx11::string::~string((string *)(local_f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f1);
    if (local_2c == 2) {
      TextureParameterDictionary::operator_cast_to_ParameterDictionary_(local_20);
      local_118._0_8_ = local_10;
      TextureMapping2DHandle::Create
                (in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000278);
      args_2 = (SpectrumTextureHandle *)&local_159;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)alloc_00.memoryResource,(allocator<char> *)args);
      this = (TextureParameterDictionary *)&stack0xfffffffffffffe7f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)alloc_00.memoryResource,(allocator<char> *)args);
      TextureParameterDictionary::GetOneString
                (this,(string *)
                      CONCAT17(in_stack_fffffffffffffdf7,
                               CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                 in_stack_fffffffffffffde8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
      std::__cxx11::string::~string((string *)((long)&local_159 + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffdf7,
                                       CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)
                                      ),(char *)in_stack_fffffffffffffde8);
      if ((!bVar1) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffdf6,
                                                             in_stack_fffffffffffffdf0)),
                                  (char *)in_stack_fffffffffffffde8), !bVar1)) {
        Warning<std::__cxx11::string&>((FileLoc *)this_00,(char *)alloc_00.memoryResource,args);
      }
      local_8 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::SpectrumCheckerboardTexture,pbrt::TextureMapping2DHandle&,decltype(nullptr),pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::AAMethod&>
                          ((polymorphic_allocator<std::byte> *)args,(TextureMapping2DHandle *)name,
                           &defaultValue->dict,args_2,(SpectrumTextureHandle *)local_20,
                           (AAMethod *)this);
      std::__cxx11::string::~string(local_138);
    }
    else {
      TextureParameterDictionary::operator_cast_to_ParameterDictionary_(local_20);
      TextureMapping3DHandle::Create
                (in_stack_fffffffffffffe80,
                 (Transform *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 in_stack_fffffffffffffe70,in_stack_fffffffffffffe88);
      local_8 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::SpectrumCheckerboardTexture,decltype(nullptr),pbrt::TextureMapping3DHandle&,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::AAMethod>
                          ((polymorphic_allocator<std::byte> *)args,(void **)name,
                           (TextureMapping3DHandle *)defaultValue,in_stack_fffffffffffffe08,
                           (SpectrumTextureHandle *)in_stack_fffffffffffffe00,
                           (AAMethod *)in_stack_fffffffffffffdf8);
    }
  }
  else {
    Error<int&>((FileLoc *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                (int *)in_stack_fffffffffffffe20);
    local_8 = (SpectrumCheckerboardTexture *)0x0;
  }
  return local_8;
}

Assistant:

SpectrumCheckerboardTexture *SpectrumCheckerboardTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    int dim = parameters.GetOneInt("dimension", 2);
    if (dim != 2 && dim != 3) {
        Error(loc, "%d dimensional checkerboard texture not supported", dim);
        return nullptr;
    }

    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    SpectrumTextureHandle tex1 =
        parameters.GetSpectrumTexture("tex1", one, SpectrumType::Reflectance, alloc);
    SpectrumTextureHandle tex2 =
        parameters.GetSpectrumTexture("tex2", zero, SpectrumType::Reflectance, alloc);
    if (dim == 2) {
        // Initialize 2D texture mapping _map_ from _tp_
        TextureMapping2DHandle map =
            TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

        // Compute _aaMethod_ for _CheckerboardTexture_
        std::string aa = parameters.GetOneString("aamode", "closedform");
        AAMethod aaMethod;
        if (aa == "none")
            aaMethod = AAMethod::None;
        else if (aa == "closedform")
            aaMethod = AAMethod::ClosedForm;
        else {
            Warning(loc,
                    "Antialiasing mode \"%s\" not understood by "
                    "Checkerboard2DTexture; using \"closedform\"",
                    aa);
            aaMethod = AAMethod::ClosedForm;
        }
        return alloc.new_object<SpectrumCheckerboardTexture>(map, nullptr, tex1, tex2,
                                                             aaMethod);
    } else {
        // Initialize 3D texture mapping _map_ from _tp_
        TextureMapping3DHandle map =
            TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
        return alloc.new_object<SpectrumCheckerboardTexture>(nullptr, map, tex1, tex2,
                                                             AAMethod::None);
    }
}